

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  ParenthesizedEventExpressionSyntax *pPVar1;
  DeepCloneVisitor visitor;
  Token local_48;
  Token local_38;
  
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x28),(DeepCloneVisitor *)&local_48,
                      (BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x30),(BumpAllocator *)__child_stack);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ParenthesizedEventExpressionSyntax,slang::parsing::Token,slang::syntax::EventExpressionSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_38,(EventExpressionSyntax *)args_1,
                      &local_48);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ParenthesizedEventExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ParenthesizedEventExpressionSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone<EventExpressionSyntax>(*node.expr, alloc),
        node.closeParen.deepClone(alloc)
    );
}